

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

unsigned_long_long strtoull_s(char *nptr,char **endptr,int base)

{
  char *pcVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  bool local_5d;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_40;
  int digitVal;
  _Bool isNegative;
  char *runner;
  unsigned_long_long uStack_28;
  _Bool validStr;
  unsigned_long_long result;
  int base_local;
  char **endptr_local;
  char *nptr_local;
  
  uStack_28 = 0;
  bVar4 = false;
  if ((((1 < base) || (pcVar1 = nptr, base == 0)) && (pcVar1 = nptr, base < 0x25)) &&
     (pcVar1 = nptr, _digitVal = nptr, nptr != (char *)0x0)) {
    while( true ) {
      bVar3 = true;
      if (((*_digitVal != ' ') && (bVar3 = true, *_digitVal != '\f')) &&
         ((bVar3 = true, *_digitVal != '\n' &&
          ((bVar3 = true, *_digitVal != '\r' && (bVar3 = true, *_digitVal != '\t')))))) {
        bVar3 = *_digitVal == '\v';
      }
      if (!bVar3) break;
      _digitVal = _digitVal + 1;
    }
    if (*_digitVal == '+') {
      _digitVal = _digitVal + 1;
    }
    else {
      bVar4 = *_digitVal == '-';
      if (bVar4) {
        _digitVal = _digitVal + 1;
      }
    }
    result._4_4_ = base;
    if (*_digitVal == '0') {
      if ((_digitVal[1] == 'x') || (_digitVal[1] == 'X')) {
        if ((base == 0) || (base == 0x10)) {
          result._4_4_ = 0x10;
          _digitVal = _digitVal + 2;
        }
      }
      else if ((base == 0) || (base == 8)) {
        result._4_4_ = 8;
        _digitVal = _digitVal + 1;
      }
    }
    if (result._4_4_ == 0) {
      result._4_4_ = 10;
    }
    if ((*_digitVal < '0') || ('9' < *_digitVal)) {
      if ((*_digitVal < 'a') || ('z' < *_digitVal)) {
        if ((*_digitVal < 'A') || ('Z' < *_digitVal)) {
          local_50 = -1;
        }
        else {
          local_50 = *_digitVal + -0x37;
        }
        local_4c = local_50;
      }
      else {
        local_4c = *_digitVal + -0x57;
      }
      local_48 = local_4c;
    }
    else {
      local_48 = *_digitVal + -0x30;
    }
    local_40 = local_48;
    pcVar1 = nptr;
    if ((-1 < local_48) && (pcVar1 = nptr, local_48 < result._4_4_)) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      do {
        if ((-(long)local_40 - 1U) / (ulong)(long)result._4_4_ < uStack_28) {
          uStack_28 = 0xffffffffffffffff;
          piVar2 = __errno_location();
          *piVar2 = 0x22;
        }
        else {
          uStack_28 = uStack_28 * (long)result._4_4_ + (long)local_40;
        }
        _digitVal = _digitVal + 1;
        if ((*_digitVal < '0') || ('9' < *_digitVal)) {
          if ((*_digitVal < 'a') || ('z' < *_digitVal)) {
            if ((*_digitVal < 'A') || ('Z' < *_digitVal)) {
              local_5c = -1;
            }
            else {
              local_5c = *_digitVal + -0x37;
            }
            local_58 = local_5c;
          }
          else {
            local_58 = *_digitVal + -0x57;
          }
          local_54 = local_58;
        }
        else {
          local_54 = *_digitVal + -0x30;
        }
        local_40 = local_54;
        local_5d = -1 < local_54 && local_54 < result._4_4_;
        pcVar1 = _digitVal;
      } while (local_5d);
    }
  }
  _digitVal = pcVar1;
  if (endptr != (char **)0x0) {
    *endptr = _digitVal;
  }
  if (bVar4) {
    uStack_28 = -uStack_28;
  }
  return uStack_28;
}

Assistant:

unsigned long long strtoull_s(const char* nptr, char** endptr, int base)
{
    unsigned long long result = 0ULL;
    bool validStr = true;
    char* runner = (char*)nptr;
    bool isNegative = false;
    int digitVal;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_005: [The strtoull_s must convert number using base 2 to 36.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_012: [If the subject sequence is empty or does not have the expected form, the strtoull_s must not perform any conversion; the value of nptr is stored in the object pointed to by endptr, provided that endptr is not a NULL pointer.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_013: [If no conversion could be performed, the strtoull_s returns the value 0L.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_035: [If the nptr is NULL, the strtoull_s must **not** perform any conversion and must returns 0L; endptr must receive NULL, provided that endptr is not a NULL pointer.]*/
        if (((base >= 2) || (base == 0)) && (base <= 36) && (runner != NULL))
    {
        /*Codes_SRS_CRT_ABSTRACTIONS_21_011: [The valid sequence starts after the first non-white-space character, followed by an optional positive or negative sign, a number or a letter(depending of the base).]*/
        /*Codes_SRS_CRT_ABSTRACTIONS_21_010: [The white-space must be one of the characters ' ', '\f', '\n', '\r', '\t', '\v'.]*/
        while (IS_SPACE(*runner))
        {
            runner++;
        }
        if ((*runner) == '+')
        {
            runner++;
        }
        else if ((*runner) == '-')
        {
            /*Codes_SRS_CRT_ABSTRACTIONS_21_038: [If the subject sequence starts with a negative sign, the strtoull_s will convert it to the posive representation of the negative value.]*/
            isNegative = true;
            runner++;
        }

        if ((*runner) == '0')
        {
            if ((*(runner+1) == 'x') || (*(runner+1) == 'X'))
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_008: [If the base is 0 and '0x' or '0X' precedes the number, strtoull_s must convert to a hexadecimal (base 16).]*/
                /* hexadecimal... */
                if ((base == 0) || (base == 16))
                {
                    base = 16;
                    runner += 2;
                }
            }
            else if((base == 0) || (base == 8))
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_009: [If the base is 0 and '0' precedes the number, strtoull_s must convert to an octal (base 8).]*/
                /* octal... */
                base = 8;
                runner++;
            }
        }

        if(base == 0)
        {
            /*Codes_SRS_CRT_ABSTRACTIONS_21_007: [If the base is 0 and no special chars precedes the number, strtoull_s must convert to a decimal (base 10).]*/
            /* decimal... */
            base = 10;
        }

        digitVal = DIGIT_VAL(*runner);
        if (validStr && IN_BASE_RANGE(digitVal, base))
        {
            errno = 0;
            do
            {
                if (((ULLONG_MAX - digitVal) / base) < result)
                {
                    /*Codes_SRS_CRT_ABSTRACTIONS_21_014: [If the correct value is outside the range, the strtoull_s returns the value ULLONG_MAX, and errno will receive the value ERANGE.]*/
                    /* overflow... */
                    result = ULLONG_MAX;
                    errno = ERANGE;
                }
                else
                {
                    result = result * base + digitVal;
                }
                runner++;
                digitVal = DIGIT_VAL(*runner);
            } while (IN_BASE_RANGE(digitVal, base));
        }
        else
        {
            runner = (char*)nptr;
        }
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_004: [The strtoull_s must return in endptr a final string of one or more unrecognized characters, including the terminating null character of the input string.]*/
    if (endptr != NULL)
    {
        (*endptr) = (char*)runner;
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_038: [If the subject sequence starts with a negative sign, the strtoull_s will convert it to the posive representation of the negative value.]*/
    if (isNegative)
    {
        result = ULLONG_MAX - result + 1;
    }

    return result;
}